

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePiece.cc
# Opt level: O1

void __thiscall
onmt::SentencePiece::SentencePiece
          (SentencePiece *this,string *model_path,int nbest_size,float alpha)

{
  SentencePieceProcessor *this_00;
  
  (this->super_SubwordEncoder)._vptr_SubwordEncoder = (_func_int **)&PTR__SentencePiece_00380e50;
  this_00 = (SentencePieceProcessor *)operator_new(0x58);
  sentencepiece::SentencePieceProcessor::SentencePieceProcessor(this_00);
  (this->_processor)._M_t.
  super___uniq_ptr_impl<sentencepiece::SentencePieceProcessor,_std::default_delete<sentencepiece::SentencePieceProcessor>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::SentencePieceProcessor_*,_std::default_delete<sentencepiece::SentencePieceProcessor>_>
  .super__Head_base<0UL,_sentencepiece::SentencePieceProcessor_*,_false>._M_head_impl = this_00;
  this->_nbest_size = nbest_size;
  this->_alpha = alpha;
  load_model(this_00,model_path);
  return;
}

Assistant:

SentencePiece::SentencePiece(const std::string& model_path, int nbest_size, float alpha)
    : _processor(new sentencepiece::SentencePieceProcessor())
    , _nbest_size(nbest_size)
    , _alpha(alpha)
  {
    load_model(*_processor, model_path);
  }